

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example5.cpp
# Opt level: O2

int main(void)

{
  uint __line;
  bool bVar1;
  char *__assertion;
  tuple<int,_int,_int,_int> local_38;
  undefined8 local_28;
  _Tuple_impl<0UL,_int,_int> local_20;
  tuple<int,_int,_int,_int> local_18;
  
  local_20.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
       (_Head_base<1UL,_int,_false>)0x2;
  local_20.super__Head_base<0UL,_int,_false>._M_head_impl = 1;
  local_28 = 0x300000004;
  concat<std::tuple<int,int>,std::tuple<int,int>>
            ((tuple<int,_int> *)&local_18,(tuple<int,_int> *)&local_20);
  local_38.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>.
  super__Tuple_impl<2UL,_int,_int>.super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>.
  _M_head_impl = (_Head_base<3UL,_int,_false>)0x4;
  local_38.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>.
  super__Tuple_impl<2UL,_int,_int>.super__Head_base<2UL,_int,_false>._M_head_impl = 3;
  local_38.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>.
  super__Head_base<1UL,_int,_false>._M_head_impl = 2;
  local_38.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Head_base<0UL,_int,_false>._M_head_impl
       = 1;
  bVar1 = std::
          __tuple_compare<std::tuple<int,_int,_int,_int>,_std::tuple<int,_int,_int,_int>,_0UL,_4UL>
          ::__eq(&local_18,&local_38);
  if (bVar1) {
    concat<std::tuple<int>,std::tuple<>,std::tuple<int>,std::tuple<int>,std::tuple<>,std::tuple<int>>
              (&local_18);
    local_38.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>.
    super__Tuple_impl<2UL,_int,_int>.super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>.
    _M_head_impl = (_Head_base<3UL,_int,_false>)0x4;
    local_38.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>.
    super__Tuple_impl<2UL,_int,_int>.super__Head_base<2UL,_int,_false>._M_head_impl = 3;
    local_38.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>.
    super__Head_base<1UL,_int,_false>._M_head_impl = 2;
    local_38.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Head_base<0UL,_int,_false>.
    _M_head_impl = 1;
    bVar1 = std::
            __tuple_compare<std::tuple<int,_int,_int,_int>,_std::tuple<int,_int,_int,_int>,_0UL,_4UL>
            ::__eq(&local_18,&local_38);
    if (bVar1) {
      return 0;
    }
    __assertion = 
    "concat(make_tuple(1), make_tuple(), make_tuple(2), make_tuple(3), make_tuple(), make_tuple(4)) == make_tuple(1, 2, 3, 4)"
    ;
    __line = 0x50;
  }
  else {
    __assertion = "concat(make_tuple(1, 2), make_tuple(3, 4)) == make_tuple(1, 2, 3, 4)";
    __line = 0x4c;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/aherrmann[P]unpacking_tuples_examples/example5.cpp"
                ,__line,"int main()");
}

Assistant:

int main() {
    assert(concat() == make_tuple());
    assert(concat(make_tuple(1, 2)) == make_tuple(1, 2));
    assert(concat(make_tuple(1, 2), make_tuple(3, 4)) ==
           make_tuple(1, 2, 3, 4));
    assert(concat(make_tuple(1), make_tuple(),
                  make_tuple(2), make_tuple(3),
                  make_tuple(),
                  make_tuple(4)) == make_tuple(1, 2, 3, 4));
}